

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvarlengtharray.h
# Opt level: O1

void __thiscall
QVLABase<QRhiColorAttachment>::append_impl
          (QVLABase<QRhiColorAttachment> *this,qsizetype prealloc,void *array,
          QRhiColorAttachment *abuf,qsizetype increment)

{
  long lVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  long lVar4;
  void *pvVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  long lVar11;
  
  if (0 < increment) {
    lVar4 = (this->super_QVLABaseBase).s;
    lVar1 = lVar4 + increment;
    if ((this->super_QVLABaseBase).a <= lVar1) {
      lVar11 = lVar4 * 2;
      if (lVar4 * 2 <= lVar1) {
        lVar11 = lVar1;
      }
      reallocate_impl(this,prealloc,array,lVar4,lVar11);
    }
    lVar4 = (this->super_QVLABaseBase).s;
    pvVar5 = (this->super_QVLABaseBase).ptr;
    lVar11 = 0;
    do {
      puVar3 = (undefined8 *)((long)&abuf->m_texture + lVar11);
      uVar6 = *puVar3;
      uVar7 = puVar3[1];
      puVar3 = (undefined8 *)((long)&abuf->m_layer + lVar11);
      uVar8 = *puVar3;
      uVar9 = puVar3[1];
      puVar3 = (undefined8 *)((long)&abuf->m_resolveLayer + lVar11);
      uVar10 = puVar3[1];
      puVar2 = (undefined8 *)((long)pvVar5 + lVar11 + lVar4 * 0x30 + 0x20);
      *puVar2 = *puVar3;
      puVar2[1] = uVar10;
      puVar3 = (undefined8 *)((long)pvVar5 + lVar11 + lVar4 * 0x30 + 0x10);
      *puVar3 = uVar8;
      puVar3[1] = uVar9;
      puVar3 = (undefined8 *)((long)pvVar5 + lVar11 + lVar4 * 0x30);
      *puVar3 = uVar6;
      puVar3[1] = uVar7;
      lVar11 = lVar11 + 0x30;
    } while (increment * 0x30 != lVar11);
    (this->super_QVLABaseBase).s = lVar1;
  }
  return;
}

Assistant:

Q_OUTOFLINE_TEMPLATE void QVLABase<T>::append_impl(qsizetype prealloc, void *array, const T *abuf, qsizetype increment)
{
    Q_ASSERT(abuf || increment == 0);
    if (increment <= 0)
        return;

    const qsizetype asize = size() + increment;

    if (asize >= capacity())
        growBy(prealloc, array, increment);

    if constexpr (QTypeInfo<T>::isComplex)
        std::uninitialized_copy_n(abuf, increment, end());
    else
        memcpy(static_cast<void *>(end()), static_cast<const void *>(abuf), increment * sizeof(T));

    this->s = asize;
}